

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

VkSamplerMipmapMode vk::mapMipmapMode(FilterMode filterMode)

{
  VkSamplerMipmapMode local_c;
  FilterMode filterMode_local;
  
  switch(filterMode) {
  case NEAREST:
    local_c = VK_SAMPLER_MIPMAP_MODE_NEAREST;
    break;
  case LINEAR:
    local_c = VK_SAMPLER_MIPMAP_MODE_NEAREST;
    break;
  case NEAREST_MIPMAP_NEAREST:
    local_c = VK_SAMPLER_MIPMAP_MODE_NEAREST;
    break;
  case NEAREST_MIPMAP_LINEAR:
    local_c = VK_SAMPLER_MIPMAP_MODE_LINEAR;
    break;
  case LINEAR_MIPMAP_NEAREST:
    local_c = VK_SAMPLER_MIPMAP_MODE_NEAREST;
    break;
  case LINEAR_MIPMAP_LINEAR:
    local_c = VK_SAMPLER_MIPMAP_MODE_LINEAR;
    break;
  default:
    local_c = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  }
  return local_c;
}

Assistant:

VkSamplerMipmapMode mapMipmapMode (tcu::Sampler::FilterMode filterMode)
{
	DE_STATIC_ASSERT(tcu::Sampler::FILTERMODE_LAST == 6);

	// \note VkSamplerCreateInfo doesn't have a flag for disabling mipmapping. Instead
	//		 minLod = 0 and maxLod = 0.25 should be used to match OpenGL NEAREST and LINEAR
	//		 filtering mode behavior.

	switch (filterMode)
	{
		case tcu::Sampler::NEAREST:					return VK_SAMPLER_MIPMAP_MODE_NEAREST;
		case tcu::Sampler::LINEAR:					return VK_SAMPLER_MIPMAP_MODE_NEAREST;
		case tcu::Sampler::NEAREST_MIPMAP_NEAREST:	return VK_SAMPLER_MIPMAP_MODE_NEAREST;
		case tcu::Sampler::NEAREST_MIPMAP_LINEAR:	return VK_SAMPLER_MIPMAP_MODE_LINEAR;
		case tcu::Sampler::LINEAR_MIPMAP_NEAREST:	return VK_SAMPLER_MIPMAP_MODE_NEAREST;
		case tcu::Sampler::LINEAR_MIPMAP_LINEAR:	return VK_SAMPLER_MIPMAP_MODE_LINEAR;
		default:
			DE_FATAL("Illegal filter mode");
			return (VkSamplerMipmapMode)0;
	}
}